

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

CodeLocation __thiscall
soul::SourceCodeUtilities::findEndOfExpression(SourceCodeUtilities *this,CodeLocation *start)

{
  bool bVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  CodeLocation CVar3;
  AbortCompilationException *anon_var_0;
  undefined1 local_90 [8];
  SimpleTokeniser tokeniser;
  CodeLocation *start_local;
  
  tokeniser.super_SOULTokeniser.literalType.text = (char *)start;
  SimpleTokeniser::SimpleTokeniser((SimpleTokeniser *)local_90,start,true);
  do {
    while( true ) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                         *)local_90,(TokenType)"$eof");
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_003aaa28;
      bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)local_90,(TokenType)",",(TokenType)0x54c9e0,(TokenType)0x571824,
                         (TokenType)0x54ceac);
      if (bVar1) {
        CodeLocation::CodeLocation
                  ((CodeLocation *)this,
                   (CodeLocation *)&tokeniser.super_SOULTokeniser.startLocation.location);
        bVar1 = true;
        goto LAB_003aaa32;
      }
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                         *)local_90,(TokenType)0x573c42);
      if (bVar1) break;
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                         *)local_90,(TokenType)"{");
      if (bVar1) {
        bVar1 = SimpleTokeniser::skipPastMatchingCloseDelimiter
                          ((SimpleTokeniser *)local_90,(TokenType)"{",(TokenType)0x54ceac);
        if (!bVar1) goto LAB_003aaa28;
      }
      else {
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                *)local_90);
      }
    }
    bVar1 = SimpleTokeniser::skipPastMatchingCloseDelimiter
                      ((SimpleTokeniser *)local_90,(TokenType)0x573c42,(TokenType)0x571824);
  } while (bVar1);
LAB_003aaa28:
  bVar1 = false;
LAB_003aaa32:
  SimpleTokeniser::~SimpleTokeniser((SimpleTokeniser *)local_90);
  UVar2.data = extraout_RDX_00;
  if (!bVar1) {
    memset(this,0,0x10);
    CodeLocation::CodeLocation((CodeLocation *)this);
    UVar2.data = extraout_RDX;
  }
  CVar3.location.data = UVar2.data;
  CVar3.sourceCode.object = (SourceCodeText *)this;
  return CVar3;
}

Assistant:

CodeLocation SourceCodeUtilities::findEndOfExpression (CodeLocation start)
{
    try
    {
        SimpleTokeniser tokeniser (start, true);

        while (! tokeniser.matches (Token::eof))
        {
            if (tokeniser.matchesAny (Operator::comma, Operator::semicolon, Operator::closeParen, Operator::closeBrace))
                return tokeniser.location;

            if (tokeniser.matches (Operator::openParen))
            {
                if (! tokeniser.skipPastMatchingCloseDelimiter (Operator::openParen, Operator::closeParen))
                    break;
            }
            else if (tokeniser.matches (Operator::openBrace))
            {
                if (! tokeniser.skipPastMatchingCloseDelimiter (Operator::openBrace, Operator::closeBrace))
                    break;
            }
            else
            {
                tokeniser.skip();
            }
        }
    }
    catch (const AbortCompilationException&) {}

    return {};
}